

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::MergeFromInternal(MapEntryImpl<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                    *this,MapEntryImpl<CoreML::Specification::MILSpec::Function_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                          *from)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  Value *pVVar3;
  undefined4 extraout_var_00;
  Arena *pAVar4;
  undefined8 *puVar5;
  
  if (from->_has_bits_[0] != 0) {
    if ((from->_has_bits_[0] & 1) != 0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        puVar5 = (undefined8 *)*puVar5;
      }
      ArenaStringPtr::Mutable_abi_cxx11_(&this->key_,puVar5);
      iVar2 = (*(from->super_MessageLite)._vptr_MessageLite[0xd])(from);
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      ArenaStringPtr::Set(&this->key_,(string *)&fixed_address_empty_string_abi_cxx11_,
                          (ConstStringParam)CONCAT44(extraout_var,iVar2),pAVar4);
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
    }
    if ((from->_has_bits_[0] & 2) != 0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      if (this->value_ == (ValueOnMemory)0x0) {
        pVVar3 = Arena::CreateMaybeMessage<CoreML::Specification::MILSpec::Value>(pAVar4);
        this->value_ = pVVar3;
      }
      iVar2 = (*(from->super_MessageLite)._vptr_MessageLite[0xe])(from);
      CoreML::Specification::MILSpec::Value::MergeFrom
                (this->value_,(Value *)CONCAT44(extraout_var_00,iVar2));
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
    }
  }
  return;
}

Assistant:

void MergeFromInternal(const MapEntryImpl& from) {
    if (from._has_bits_[0]) {
      if (from.has_key()) {
        KeyTypeHandler::EnsureMutable(&key_, Base::GetArenaForAllocation());
        KeyTypeHandler::Merge(from.key(), &key_, Base::GetArenaForAllocation());
        set_has_key();
      }
      if (from.has_value()) {
        ValueTypeHandler::EnsureMutable(&value_, Base::GetArenaForAllocation());
        ValueTypeHandler::Merge(from.value(), &value_,
                                Base::GetArenaForAllocation());
        set_has_value();
      }
    }
  }